

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O3

void __thiscall
Assimp::ASEImporter::AddNodes
          (ASEImporter *this,
          vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *nodes,
          aiNode *pcParent,char *szName,aiMatrix4x4 *mat)

{
  float fVar1;
  BaseNode *snode;
  size_type sVar2;
  pointer pcVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  _IEEESingle temp;
  int iVar15;
  ai_uint32 aVar16;
  uint uVar17;
  aiNode *paVar18;
  size_t sVar19;
  aiNode *paVar20;
  ulong uVar21;
  Logger *this_00;
  long *plVar22;
  long lVar23;
  aiNode **ppaVar24;
  long *plVar25;
  char *pcVar26;
  size_type sVar27;
  void *pvVar28;
  pointer ppBVar29;
  vector<aiNode_*,_std::allocator<aiNode_*>_> apcNodes;
  aiMatrix4x4 mParentAdjust;
  long *local_128;
  ulong local_120;
  long local_118;
  long lStack_110;
  void *local_108;
  void *pvStack_100;
  long local_f8;
  size_type local_f0;
  char *local_e8;
  vector<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_> *local_e0;
  aiNode *local_d8;
  ASEImporter *local_d0;
  aiMatrix4x4t<float> local_c8;
  aiMatrix4x4 *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  pointer local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_e0 = nodes;
  local_d0 = this;
  local_80 = mat;
  if (szName == (char *)0x0) {
    local_f0 = 0;
  }
  else {
    local_f0 = strlen(szName);
  }
  local_108 = (void *)0x0;
  pvStack_100 = (void *)0x0;
  local_f8 = 0;
  ppBVar29 = (local_e0->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_70 = (local_e0->
             super__Vector_base<Assimp::ASE::BaseNode_*,_std::allocator<Assimp::ASE::BaseNode_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  sVar27 = local_f0;
  pcVar26 = szName;
  paVar18 = pcParent;
  if (ppBVar29 != local_70) {
    do {
      local_d8 = paVar18;
      local_e8 = pcVar26;
      snode = *ppBVar29;
      sVar2 = (snode->mParent)._M_string_length;
      if (szName == (char *)0x0) {
        if (sVar2 == 0) goto LAB_003d7cc9;
      }
      else if ((sVar27 == sVar2) &&
              (iVar15 = strcmp(szName,(snode->mParent)._M_dataplus._M_p), iVar15 == 0)) {
LAB_003d7cc9:
        snode->mProcessed = true;
        paVar18 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar18);
        local_c8._0_8_ = paVar18;
        std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                  ((vector<aiNode*,std::allocator<aiNode*>> *)&local_108,(aiNode **)&local_c8);
        local_78 = &snode->mName;
        pcVar26 = "Unnamed_Node";
        if ((snode->mName)._M_string_length != 0) {
          pcVar26 = (local_78->_M_dataplus)._M_p;
        }
        paVar18 = *(aiNode **)((long)pvStack_100 + -8);
        sVar19 = strlen(pcVar26);
        aVar16 = (ai_uint32)sVar19;
        if ((int)aVar16 < 0x400) {
          (paVar18->mName).length = aVar16;
          memcpy((paVar18->mName).data,pcVar26,(long)(int)aVar16);
          (paVar18->mName).data[(int)aVar16] = '\0';
          szName = local_e8;
        }
        paVar18->mParent = local_d8;
        local_c8.a1 = local_80->a1;
        local_c8.a2 = local_80->a2;
        local_c8.a3 = local_80->a3;
        local_c8.a4 = local_80->a4;
        local_c8.b1 = local_80->b1;
        local_c8.b2 = local_80->b2;
        local_c8.b3 = local_80->b3;
        local_c8.b4 = local_80->b4;
        local_c8.c1 = local_80->c1;
        local_c8.c2 = local_80->c2;
        local_c8.c3 = local_80->c3;
        local_c8.c4 = local_80->c4;
        local_c8.d1 = local_80->d1;
        local_c8.d2 = local_80->d2;
        local_c8.d3 = local_80->d3;
        local_c8.d4 = local_80->d4;
        aiMatrix4x4t<float>::Inverse(&local_c8);
        local_48 = (snode->mTransform).a1;
        fStack_44 = (snode->mTransform).a2;
        fStack_40 = (snode->mTransform).a3;
        fStack_3c = (snode->mTransform).a4;
        fVar1 = (snode->mTransform).b1;
        fVar4 = (snode->mTransform).b2;
        fVar5 = (snode->mTransform).b3;
        fVar6 = (snode->mTransform).b4;
        fVar7 = (snode->mTransform).c1;
        fVar8 = (snode->mTransform).c2;
        fVar9 = (snode->mTransform).c3;
        fVar10 = (snode->mTransform).c4;
        fVar11 = (snode->mTransform).d1;
        fVar12 = (snode->mTransform).d2;
        fVar13 = (snode->mTransform).d3;
        fVar14 = (snode->mTransform).d4;
        (paVar18->mTransformation).a1 =
             local_c8.a4 * fVar11 +
             local_c8.a3 * fVar7 + local_c8.a1 * local_48 + local_c8.a2 * fVar1;
        (paVar18->mTransformation).a2 =
             local_c8.a4 * fVar12 +
             local_c8.a3 * fVar8 + local_c8.a1 * fStack_44 + local_c8.a2 * fVar4;
        (paVar18->mTransformation).a3 =
             local_c8.a4 * fVar13 +
             local_c8.a3 * fVar9 + local_c8.a1 * fStack_40 + local_c8.a2 * fVar5;
        (paVar18->mTransformation).a4 =
             local_c8.a4 * fVar14 +
             local_c8.a3 * fVar10 + local_c8.a1 * fStack_3c + local_c8.a2 * fVar6;
        (paVar18->mTransformation).b1 =
             local_c8.b4 * fVar11 +
             local_c8.b3 * fVar7 + local_c8.b1 * local_48 + local_c8.b2 * fVar1;
        (paVar18->mTransformation).b2 =
             local_c8.b4 * fVar12 +
             local_c8.b3 * fVar8 + local_c8.b1 * fStack_44 + local_c8.b2 * fVar4;
        (paVar18->mTransformation).b3 =
             local_c8.b4 * fVar13 +
             local_c8.b3 * fVar9 + local_c8.b1 * fStack_40 + local_c8.b2 * fVar5;
        (paVar18->mTransformation).b4 =
             local_c8.b4 * fVar14 +
             local_c8.b3 * fVar10 + local_c8.b1 * fStack_3c + local_c8.b2 * fVar6;
        (paVar18->mTransformation).c1 =
             local_c8.c4 * fVar11 +
             local_c8.c3 * fVar7 + local_c8.c1 * local_48 + local_c8.c2 * fVar1;
        (paVar18->mTransformation).c2 =
             local_c8.c4 * fVar12 +
             local_c8.c3 * fVar8 + local_c8.c1 * fStack_44 + local_c8.c2 * fVar4;
        (paVar18->mTransformation).c3 =
             local_c8.c4 * fVar13 +
             local_c8.c3 * fVar9 + local_c8.c1 * fStack_40 + local_c8.c2 * fVar5;
        (paVar18->mTransformation).c4 =
             local_c8.c4 * fVar14 +
             local_c8.c3 * fVar10 + local_c8.c1 * fStack_3c + local_c8.c2 * fVar6;
        (paVar18->mTransformation).d1 =
             local_c8.d4 * fVar11 +
             local_c8.d3 * fVar7 + local_c8.d1 * local_48 + local_c8.d2 * fVar1;
        (paVar18->mTransformation).d2 =
             local_c8.d4 * fVar12 +
             local_c8.d3 * fVar8 + local_c8.d1 * fStack_44 + local_c8.d2 * fVar4;
        (paVar18->mTransformation).d3 =
             local_c8.d4 * fVar13 +
             local_c8.d3 * fVar9 + local_c8.d1 * fStack_40 + local_c8.d2 * fVar5;
        (paVar18->mTransformation).d4 =
             local_c8.d4 * fVar14 +
             local_c8.d3 * fVar10 + local_c8.d1 * fStack_3c + local_c8.d2 * fVar6;
        paVar20 = paVar18->mParent;
        uVar17 = (paVar18->mName).length;
        if (((uVar17 != (paVar20->mName).length) ||
            (iVar15 = bcmp((paVar18->mName).data,(paVar20->mName).data,(ulong)uVar17), iVar15 != 0))
           && ((uVar17 != (paVar20->mParent->mName).length ||
               (iVar15 = bcmp((paVar18->mName).data,(paVar20->mParent->mName).data,(ulong)uVar17),
               iVar15 != 0)))) {
          AddNodes(local_d0,local_e0,paVar18,(paVar18->mName).data,&snode->mTransform);
        }
        if (snode->mType == Mesh) {
          AddMeshes(local_d0,snode,paVar18);
          sVar27 = local_f0;
        }
        else {
          fVar1 = (snode->mTargetPosition).x;
          sVar27 = local_f0;
          if ((~(uint)fVar1 & 0x7f800000) != 0 || ((uint)fVar1 & 0x7fffff) == 0) {
            if (paVar18->mNumChildren == 0) {
              ppaVar24 = (aiNode **)operator_new__(8);
              paVar18->mChildren = ppaVar24;
            }
            paVar20 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(paVar20);
            pcVar3 = (snode->mName)._M_dataplus._M_p;
            local_128 = &local_118;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,pcVar3,pcVar3 + (snode->mName)._M_string_length);
            std::__cxx11::string::append((char *)&local_128);
            uVar21 = local_120;
            plVar22 = local_128;
            if (local_120 < 0x400) {
              (paVar20->mName).length = (ai_uint32)local_120;
              memcpy((paVar20->mName).data,local_128,local_120);
              (paVar20->mName).data[uVar21] = '\0';
            }
            if (plVar22 != &local_118) {
              operator_delete(plVar22,local_118 + 1);
            }
            szName = local_e8;
            (paVar20->mTransformation).a4 = (snode->mTargetPosition).x - (snode->mTransform).a4;
            (paVar20->mTransformation).b4 = (snode->mTargetPosition).y - (snode->mTransform).b4;
            (paVar20->mTransformation).c4 = (snode->mTargetPosition).z - (snode->mTransform).c4;
            paVar20->mParent = paVar18;
            if (paVar18->mNumChildren != 0) {
              uVar21 = 0;
              do {
                paVar18->mChildren[uVar21 + 1] = paVar18->mChildren[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar21 < paVar18->mNumChildren);
            }
            *paVar18->mChildren = paVar20;
            paVar18->mNumChildren = paVar18->mNumChildren + 1;
            this_00 = DefaultLogger::get();
            std::operator+(&local_68,"ASE: Generating separate target node (",local_78);
            plVar22 = (long *)std::__cxx11::string::append((char *)&local_68);
            plVar25 = plVar22 + 2;
            if ((long *)*plVar22 == plVar25) {
              local_118 = *plVar25;
              lStack_110 = plVar22[3];
              local_128 = &local_118;
            }
            else {
              local_118 = *plVar25;
              local_128 = (long *)*plVar22;
            }
            local_120 = plVar22[1];
            *plVar22 = (long)plVar25;
            plVar22[1] = 0;
            *(undefined1 *)(plVar22 + 2) = 0;
            Logger::debug(this_00,(char *)local_128);
            if (local_128 != &local_118) {
              operator_delete(local_128,local_118 + 1);
            }
            sVar27 = local_f0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
              sVar27 = local_f0;
            }
          }
        }
      }
      ppBVar29 = ppBVar29 + 1;
      pcParent = local_d8;
      pcVar26 = local_e8;
      paVar18 = local_d8;
    } while (ppBVar29 != local_70);
  }
  pvVar28 = local_108;
  lVar23 = (long)pvStack_100 - (long)local_108 >> 3;
  pcParent->mNumChildren = (uint)lVar23;
  if ((uint)lVar23 != 0) {
    ppaVar24 = (aiNode **)operator_new__(-(ulong)(lVar23 + 1U >> 0x3d != 0) | lVar23 * 8 + 8U);
    pcParent->mChildren = ppaVar24;
    if (pvStack_100 != pvVar28) {
      uVar17 = 1;
      uVar21 = 0;
      do {
        pcParent->mChildren[uVar21] = *(aiNode **)((long)pvVar28 + uVar21 * 8);
        uVar21 = (ulong)uVar17;
        uVar17 = uVar17 + 1;
        pvVar28 = local_108;
      } while (uVar21 < (ulong)((long)pvStack_100 - (long)local_108 >> 3));
    }
  }
  if (pvVar28 != (void *)0x0) {
    operator_delete(pvVar28,local_f8 - (long)pvVar28);
  }
  return;
}

Assistant:

void ASEImporter::AddNodes (const std::vector<BaseNode*>& nodes,
    aiNode* pcParent, const char* szName,
    const aiMatrix4x4& mat)
{
    const size_t len = szName ? ::strlen(szName) : 0;
    ai_assert(4 <= AI_MAX_NUMBER_OF_COLOR_SETS);

    // Receives child nodes for the pcParent node
    std::vector<aiNode*> apcNodes;

    // Now iterate through all nodes in the scene and search for one
    // which has *us* as parent.
    for (std::vector<BaseNode*>::const_iterator it = nodes.begin(), end = nodes.end(); it != end; ++it) {
        const BaseNode* snode = *it;
        if (szName) {
            if (len != snode->mParent.length() || ::strcmp(szName,snode->mParent.c_str()))
                continue;
        }
        else if (snode->mParent.length())
            continue;

        (*it)->mProcessed = true;

        // Allocate a new node and add it to the output data structure
        apcNodes.push_back(new aiNode());
        aiNode* node = apcNodes.back();

        node->mName.Set((snode->mName.length() ? snode->mName.c_str() : "Unnamed_Node"));
        node->mParent = pcParent;

        // Setup the transformation matrix of the node
        aiMatrix4x4 mParentAdjust  = mat;
        mParentAdjust.Inverse();
        node->mTransformation = mParentAdjust*snode->mTransform;

        // Add sub nodes - prevent stack overflow due to recursive parenting
        if (node->mName != node->mParent->mName && node->mName != node->mParent->mParent->mName ) {
            AddNodes(nodes,node,node->mName.data,snode->mTransform);
        }

        // Further processing depends on the type of the node
        if (snode->mType == ASE::BaseNode::Mesh)    {
            // If the type of this node is "Mesh" we need to search
            // the list of output meshes in the data structure for
            // all those that belonged to this node once. This is
            // slightly inconvinient here and a better solution should
            // be used when this code is refactored next.
            AddMeshes(snode,node);
        }
        else if (is_not_qnan( snode->mTargetPosition.x ))   {
            // If this is a target camera or light we generate a small
            // child node which marks the position of the camera
            // target (the direction information is contained in *this*
            // node's animation track but the exact target position
            // would be lost otherwise)
            if (!node->mNumChildren)    {
                node->mChildren = new aiNode*[1];
            }

            aiNode* nd = new aiNode();

            nd->mName.Set ( snode->mName + ".Target" );

            nd->mTransformation.a4 = snode->mTargetPosition.x - snode->mTransform.a4;
            nd->mTransformation.b4 = snode->mTargetPosition.y - snode->mTransform.b4;
            nd->mTransformation.c4 = snode->mTargetPosition.z - snode->mTransform.c4;

            nd->mParent = node;

            // The .Target node is always the first child node
            for (unsigned int m = 0; m < node->mNumChildren;++m)
                node->mChildren[m+1] = node->mChildren[m];

            node->mChildren[0] = nd;
            node->mNumChildren++;

            // What we did is so great, it is at least worth a debug message
            ASSIMP_LOG_DEBUG("ASE: Generating separate target node ("+snode->mName+")");
        }
    }

    // Allocate enough space for the child nodes
    // We allocate one slot more  in case this is a target camera/light
    pcParent->mNumChildren = (unsigned int)apcNodes.size();
    if (pcParent->mNumChildren) {
        pcParent->mChildren = new aiNode*[apcNodes.size()+1 /* PLUS ONE !!! */];

        // now build all nodes for our nice new children
        for (unsigned int p = 0; p < apcNodes.size();++p)
            pcParent->mChildren[p] = apcNodes[p];
    }
    return;
}